

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O2

void bool2int(BoolView *x,IntVar *y)

{
  int iVar1;
  BoolView local_58;
  BoolView local_48;
  BoolView local_38;
  
  int_rel(y,IRT_GE,0);
  int_rel(y,IRT_LE,1);
  IntVar::specialiseToEL(y);
  local_38.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_001efbb8;
  local_38.v = x->v;
  local_38.s = x->s;
  iVar1 = (*(y->super_Var).super_Branching._vptr_Branching[0xd])(y,1,2);
  local_48.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_001efbb8;
  local_48.v = iVar1 >> 1;
  local_48.s = (bool)((byte)iVar1 & 1);
  local_58.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_001efbb8;
  local_58.v = bv_true.v;
  local_58.s = bv_true.s;
  bool_rel(&local_38,BRT_EQ,&local_48,&local_58);
  return;
}

Assistant:

void bool2int(BoolView x, IntVar* y) {
	int_rel(y, IRT_GE, 0);
	int_rel(y, IRT_LE, 1);
	y->specialiseToEL();
	bool_rel(std::move(x), BRT_EQ, BoolView(y->getLit(1, LR_GE)));
}